

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O1

void sprintf<int,int>(stringstream *oss,string *fmt,int value,int args)

{
  ostream *this;
  ostream *poVar1;
  byte bVar2;
  int iVar3;
  pointer pcVar4;
  long lVar5;
  char *pcVar6;
  bool bVar7;
  ostream oVar8;
  runtime_error *prVar9;
  int *piVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  char *pcVar15;
  bool bVar16;
  undefined1 auVar17 [12];
  string local_60;
  char *local_40;
  int local_38;
  int local_34;
  
  bVar16 = fmt->_M_string_length != 0;
  local_38 = value;
  local_34 = args;
  if (bVar16) {
    this = (ostream *)(oss + 0x10);
    uVar12 = 0;
    do {
      pcVar4 = (fmt->_M_dataplus)._M_p;
      uVar13 = uVar12;
      if ((pcVar4[uVar12] == '%') && (uVar13 = uVar12 + 1, pcVar4[uVar12 + 1] != '%')) {
        uVar12 = std::__cxx11::string::find_first_of((char *)fmt,0x12ed72,uVar13);
        if (uVar12 <= uVar13) {
          bVar7 = false;
          uVar14 = uVar13;
          goto LAB_0011c033;
        }
        bVar7 = false;
        goto LAB_0011bf5e;
      }
      local_60._M_dataplus._M_p._0_1_ = pcVar4[uVar13];
      std::__ostream_insert<char,std::char_traits<char>>(this,(char *)&local_60,1);
      uVar12 = uVar13 + 1;
      bVar16 = uVar12 < fmt->_M_string_length;
    } while (bVar16);
  }
  goto LAB_0011befd;
LAB_0011bf5e:
  do {
    bVar2 = (fmt->_M_dataplus)._M_p[uVar13];
    uVar14 = uVar13;
    if (bVar2 < 0x2b) {
      if (bVar2 != 0x20) {
        if (bVar2 != 0x23) break;
        bVar7 = true;
      }
    }
    else if (bVar2 == 0x2b) {
      *(uint *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x28) =
           *(uint *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x28) | 0x800;
    }
    else if (bVar2 == 0x2d) {
      *(uint *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x28) =
           *(uint *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x28) & 0xffffff4f | 0x20;
    }
    else {
      if (bVar2 != 0x30) break;
      if (((byte)oss[*(long *)(*(long *)oss + -0x18) + 0x18] & 0x20) == 0) {
        poVar1 = this + *(long *)(*(long *)this + -0x18);
        if (oss[*(long *)(*(long *)this + -0x18) + 0xf1] == (stringstream)0x0) {
          oVar8 = (ostream)std::ios::widen((char)poVar1);
          poVar1[0xe0] = oVar8;
          poVar1[0xe1] = (ostream)0x1;
        }
        poVar1[0xe0] = (ostream)0x30;
      }
    }
    uVar13 = uVar13 + 1;
    uVar14 = uVar12;
  } while (uVar12 != uVar13);
LAB_0011c033:
  std::__cxx11::string::substr((ulong)&local_60,(ulong)fmt);
  pcVar6 = (char *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p);
  piVar10 = __errno_location();
  iVar3 = *piVar10;
  *piVar10 = 0;
  lVar11 = strtol(pcVar6,&local_40,10);
  pcVar15 = local_40;
  if (local_40 == pcVar6) {
    std::__throw_invalid_argument("stoi");
LAB_0011c29b:
    std::__throw_out_of_range("stoi");
  }
  else {
    if ((lVar11 - 0x80000000U < 0xffffffff00000000) || (*piVar10 == 0x22)) goto LAB_0011c29b;
    if (*piVar10 == 0) {
      *piVar10 = iVar3;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p) !=
        &local_60.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p),
                      local_60.field_2._M_allocated_capacity + 1);
    }
    *(long *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x20) = (long)(int)lVar11;
    pcVar15 = pcVar15 + (uVar14 - (long)pcVar6);
    if (pcVar15[(long)(fmt->_M_dataplus)._M_p] != '.') {
LAB_0011c1e7:
      if ((byte)(pcVar15[(long)(fmt->_M_dataplus)._M_p] | 0x20U) == 0x78) {
        lVar11 = *(long *)(oss + 0x10);
        lVar5 = *(long *)(lVar11 + -0x18);
        *(uint *)(oss + lVar5 + 0x28) = *(uint *)(oss + lVar5 + 0x28) & 0xffffffb5 | 8;
        if (bVar7) {
          *(uint *)(oss + *(long *)(lVar11 + -0x18) + 0x28) =
               *(uint *)(oss + *(long *)(lVar11 + -0x18) + 0x28) | 0x200;
        }
      }
      std::ostream::operator<<(this,local_38);
      std::__cxx11::string::substr((ulong)&local_60,(ulong)fmt);
      sprintf<int>(oss,&local_60,local_34);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p) !=
          &local_60.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p),
                        local_60.field_2._M_allocated_capacity + 1);
      }
      if (bVar16) {
        return;
      }
LAB_0011befd:
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar9,"extra arguments provided to sprintf");
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::substr((ulong)&local_60,(ulong)fmt);
    pcVar6 = (char *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p);
    piVar10 = __errno_location();
    iVar3 = *piVar10;
    *piVar10 = 0;
    lVar11 = strtol(pcVar6,&local_40,10);
    if (local_40 != pcVar6) {
      if ((lVar11 - 0x80000000U < 0xffffffff00000000) || (*piVar10 == 0x22)) goto LAB_0011c2b3;
      if (*piVar10 == 0) {
        *piVar10 = iVar3;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p) !=
          &local_60.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p),
                        local_60.field_2._M_allocated_capacity + 1);
      }
      *(long *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x18) = (long)(int)lVar11;
      pcVar15 = local_40 + (long)(pcVar15 + (1 - (long)pcVar6));
      goto LAB_0011c1e7;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_0011c2b3:
  auVar17 = std::__throw_out_of_range("stoi");
  if (auVar17._8_4_ != 1) {
    _Unwind_Resume(auVar17._0_8_);
  }
  __cxa_begin_catch(auVar17._0_8_);
  prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar9,"Expected precision value in sprintf");
  __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
sprintf(stringstream& oss, const string& fmt, T value, Args ... args)
{
    for (size_t pos = 0; pos < fmt.size(); pos++) {
        if (fmt[pos] == '%' && fmt[++pos] != '%') {
            bool alternateForm = false;
            // Find the format character
            size_t fpos = fmt.find_first_of("diouXxfFeEgGaAcsb", pos);
            for (; pos < fpos; pos++) {
                switch (fmt[pos]) {
                  case '#':
                    alternateForm = true;
                    continue;
                  case '-':
                    oss << left;
                    continue;
                  case '+':
                    oss << showpos;
                    continue;
                  case ' ':
                    continue;
                  case '0':
                    if (!(oss.flags() & oss.left))
                        oss << setfill('0');
                    continue;
                  default:
                    break;
                }
                break;
            }
            try {
                size_t afterpos;
                int width = stoi(fmt.substr(pos, fpos - pos), &afterpos);
                oss << setw(width);
                pos += afterpos;
            } catch (invalid_argument& e) {
                (void)e;
            }
            int precision = 0;
            if (fmt[pos] == '.') try {
                size_t afterpos;
                ++pos;
                precision = stoi(fmt.substr(pos, fpos - pos), &afterpos);
                if (!std::is_same<T, const char*>::value) {
                     oss << setprecision(precision);
                     precision = 0;
                }
                pos += afterpos;
            } catch (invalid_argument& e) {
                throw std::runtime_error("Expected precision value in sprintf");
                (void)e;
            }
            if (fmt[pos] == 'x' || fmt[pos] == 'X') {
                oss << hex;
                if (alternateForm) oss << showbase;
            }
            // Having another function call sucks. See streamout for the reason.
            streamout(oss, value, precision);
            return sprintf(oss, fmt.substr(++pos), args...);
        }
        oss << fmt[pos];
    }
    throw std::runtime_error("extra arguments provided to sprintf");
}